

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basis.cpp
# Opt level: O0

void __thiscall Basis::deactivate(Basis *this,HighsInt conid)

{
  mapped_type *pmVar1;
  value_type_conflict2 *in_RDI;
  vector<int,_std::allocator<int>_> *unaff_retaddr;
  key_type_conflict1 *in_stack_00000028;
  map<int,_BasisStatus,_std::less<int>,_std::allocator<std::pair<const_int,_BasisStatus>_>_>
  *in_stack_00000030;
  
  pmVar1 = std::
           map<int,_BasisStatus,_std::less<int>,_std::allocator<std::pair<const_int,_BasisStatus>_>_>
           ::operator[](in_stack_00000030,in_stack_00000028);
  *pmVar1 = kInactiveInBasis;
  remove<int>((vector<int,_std::allocator<int>_> *)in_stack_00000030,in_stack_00000028);
  std::vector<int,_std::allocator<int>_>::push_back(unaff_retaddr,in_RDI);
  return;
}

Assistant:

void Basis::deactivate(HighsInt conid) {
  // printf("deact %" HIGHSINT_FORMAT "\n", conid);
  assert(contains(active_constraint_index, conid));
  basisstatus[conid] = BasisStatus::kInactiveInBasis;
  remove(active_constraint_index, conid);
  non_active_constraint_index.push_back(conid);
}